

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_help.c
# Opt level: O0

void cfg_help_token(autobuf *out,_Bool preamble,cfg_schema_entry *token_entry,
                   cfg_schema_entry *sub_entries,size_t entry_count,
                   cfg_schema_token_customizer *customizer)

{
  char *pcVar1;
  ulong local_60;
  size_t i;
  char enum_buffer [20];
  cfg_schema_token_customizer *customizer_local;
  size_t entry_count_local;
  cfg_schema_entry *sub_entries_local;
  cfg_schema_entry *token_entry_local;
  _Bool preamble_local;
  autobuf *out_local;
  
  if (preamble) {
    abuf_appendf(out,"    Parameter is a list of %zu whitespace separater tokens (",entry_count);
    for (local_60 = 0; local_60 < entry_count; local_60 = local_60 + 1) {
      pcVar1 = ", ";
      if (local_60 == 0) {
        pcVar1 = "";
      }
      abuf_appendf(out,"%s%s",pcVar1,sub_entries[local_60].key.entry);
    }
    abuf_puts(out,
              ").\n    The last token gets the rest of the string, regardless of the number of whitespaces used.\n\n"
             );
  }
  if ((customizer != (cfg_schema_token_customizer *)0x0) &&
     (customizer->cb_valhelp != (_func_void_cfg_schema_entry_ptr_autobuf_ptr *)0x0)) {
    (*customizer->cb_valhelp)(token_entry,out);
  }
  for (local_60 = 0; local_60 < entry_count; local_60 = local_60 + 1) {
    pcVar1 = _get_enumerator((char *)&i,0x14,local_60);
    abuf_appendf(out,"    Description of the %s token \'%s\':\n",pcVar1,
                 sub_entries[local_60].key.entry);
    if (sub_entries[local_60].help != (char *)0x0) {
      abuf_appendf(out,"        %s\n",sub_entries[local_60].help);
    }
    if (sub_entries[local_60].cb_valhelp != (_func_void_cfg_schema_entry_ptr_autobuf_ptr *)0x0) {
      (*sub_entries[local_60].cb_valhelp)(sub_entries + local_60,out);
    }
    abuf_puts(out,"\n");
  }
  return;
}

Assistant:

void
cfg_help_token(struct autobuf *out, bool preamble, const struct cfg_schema_entry *token_entry,
  const struct cfg_schema_entry *sub_entries, size_t entry_count,
  const struct cfg_schema_token_customizer *customizer) {
  char enum_buffer[20];
  size_t i;

  if (preamble) {
    abuf_appendf(out,
      CFG_HELP_INDENT_PREFIX "Parameter is a list of"
                             " %" PRINTF_SIZE_T_SPECIFIER " whitespace separater tokens (",
      entry_count);
    for (i = 0; i < entry_count; i++) {
      abuf_appendf(out, "%s%s", i == 0 ? "" : ", ", sub_entries[i].key.entry);
    }
    abuf_puts(out, ").\n" CFG_HELP_INDENT_PREFIX "The last token gets the rest of the string, regardless of"
                   " the number of whitespaces used.\n\n");
  }
  if (customizer && customizer->cb_valhelp) {
    customizer->cb_valhelp(token_entry, out);
  }

  for (i = 0; i < entry_count; i++) {
    abuf_appendf(out, CFG_HELP_INDENT_PREFIX "Description of the %s token '%s':\n",
      _get_enumerator(enum_buffer, sizeof(enum_buffer), i), sub_entries[i].key.entry);

    if (sub_entries[i].help) {
      abuf_appendf(out, CFG_HELP_INDENT_PREFIX CFG_HELP_INDENT_PREFIX "%s\n", sub_entries[i].help);
    }
    if (sub_entries[i].cb_valhelp) {
      sub_entries[i].cb_valhelp(&sub_entries[i], out);
    }
    abuf_puts(out, "\n");
  }
}